

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gim_contact.cpp
# Opt level: O1

void __thiscall
gim_contact_array::merge_contacts_unique(gim_contact_array *this,gim_contact_array *contacts)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  uint uVar3;
  undefined8 *puVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  ulong uVar9;
  void *pvVar10;
  float *pfVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  
  if (*(int *)(this + 8) != 0) {
    *(undefined4 *)(this + 8) = 0;
  }
  uVar14 = *(uint *)(contacts + 8);
  uVar9 = (ulong)uVar14;
  puVar4 = *(undefined8 **)contacts;
  if (uVar9 == 1) {
    uVar14 = *(uint *)(this + 8);
    uVar3 = *(uint *)(this + 0xc);
    if (uVar3 <= uVar14) {
      *(uint *)(this + 8) = uVar3;
      uVar14 = uVar14 * 2 + 4;
      if (uVar14 == 0) {
        *(undefined4 *)(this + 0xc) = 0;
        if (*(void **)this != (void *)0x0) {
          gim_free(*(void **)this);
          *(undefined8 *)this = 0;
        }
      }
      else {
        if (uVar3 == 0) {
          pvVar10 = gim_alloc((ulong)uVar14 * 0x30);
        }
        else {
          pvVar10 = gim_realloc(*(void **)this,(ulong)uVar3 * 0x30,(ulong)uVar14 * 0x30);
        }
        *(void **)this = pvVar10;
        *(uint *)(this + 0xc) = uVar14;
      }
    }
    lVar13 = *(long *)this;
    lVar12 = (ulong)*(uint *)(this + 8) * 0x30;
    uVar2 = *puVar4;
    uVar5 = puVar4[1];
    uVar6 = puVar4[2];
    uVar7 = puVar4[3];
    uVar8 = puVar4[5];
    puVar1 = (undefined8 *)(lVar13 + 0x20 + lVar12);
    *puVar1 = puVar4[4];
    puVar1[1] = uVar8;
    puVar4 = (undefined8 *)(lVar13 + 0x10 + lVar12);
    *puVar4 = uVar6;
    puVar4[1] = uVar7;
    *(undefined8 *)(lVar13 + lVar12) = uVar2;
    ((undefined8 *)(lVar13 + lVar12))[1] = uVar5;
    *(int *)(this + 8) = *(int *)(this + 8) + 1;
  }
  else {
    fVar17 = *(float *)(puVar4 + (ulong)(uVar14 - 1) * 6 + 2);
    uVar2 = *(undefined8 *)((long)puVar4 + (ulong)(uVar14 - 1) * 0x30 + 0x14);
    fVar15 = (float)uVar2;
    fVar16 = (float)((ulong)uVar2 >> 0x20);
    if (uVar14 != 0) {
      pfVar11 = (float *)(puVar4 + 10);
      lVar13 = uVar9 - 1;
      do {
        fVar18 = *pfVar11;
        fVar17 = fVar17 + pfVar11[-4] * fVar18;
        fVar15 = fVar15 + fVar18 * pfVar11[-3];
        fVar16 = fVar16 + pfVar11[-2] * fVar18;
        pfVar11 = pfVar11 + 0xc;
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
    }
    fVar18 = 1.0 / (float)uVar9;
    fVar17 = fVar16 * fVar18 * fVar16 * fVar18 +
             fVar17 * fVar18 * fVar17 * fVar18 + fVar18 * fVar15 * fVar18 * fVar15;
    if (fVar17 < 0.0) {
      sqrtf(fVar17);
      return;
    }
  }
  return;
}

Assistant:

void gim_contact_array::merge_contacts_unique(const gim_contact_array & contacts)
{
	clear();

	if(contacts.size()==1)
	{
		push_back(contacts.back());
		return;
	}

	GIM_CONTACT average_contact = contacts.back();

	for (GUINT i=1;i<contacts.size() ;i++ )
	{
		average_contact.m_point += contacts[i].m_point;
		average_contact.m_normal += contacts[i].m_normal * contacts[i].m_depth;
	}

	//divide
	GREAL divide_average = 1.0f/((GREAL)contacts.size());

	average_contact.m_point *= divide_average;

	average_contact.m_normal *= divide_average;

	average_contact.m_depth = average_contact.m_normal.length();

	average_contact.m_normal /= average_contact.m_depth;

}